

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::NumberFormatPartsBuilder::GetPartTypeString
          (NumberFormatPartsBuilder *this,UNumberFormatFields field)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptString *pJVar5;
  
  pJVar1 = (((this->sc).ptr)->super_ScriptContextBase).javascriptLibrary;
  switch(field) {
  case UNUM_INTEGER_FIELD:
    bVar3 = NumberUtilities::IsNan(this->num);
    if (bVar3) {
      pJVar5 = StringCache::GetIntlNanPart(&pJVar1->stringCache);
      return pJVar5;
    }
    bVar3 = NumberUtilities::IsFinite(this->num);
    if (!bVar3) {
      pJVar5 = StringCache::GetIntlInfinityPart(&pJVar1->stringCache);
      return pJVar5;
    }
    pJVar5 = StringCache::GetIntlIntegerPart(&pJVar1->stringCache);
    return pJVar5;
  case UNUM_FRACTION_FIELD:
    pJVar5 = StringCache::GetIntlFractionPart(&pJVar1->stringCache);
    return pJVar5;
  case UNUM_DECIMAL_SEPARATOR_FIELD:
    pJVar5 = StringCache::GetIntlDecimalPart(&pJVar1->stringCache);
    return pJVar5;
  case UNUM_EXPONENT_SYMBOL_FIELD:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x8f5,"(false)","Unexpected exponent symbol field");
    if (!bVar3) goto LAB_00b6c78e;
    *puVar4 = 0;
switchD_00b6c4f6_caseD_4:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x8f6,"(false)","Unexpected exponent sign field");
    if (bVar3) {
      *puVar4 = 0;
switchD_00b6c4f6_caseD_5:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x8f7,"(false)","Unexpected exponent field");
      if (bVar3) {
        *puVar4 = 0;
switchD_00b6c4f6_caseD_6:
        pJVar5 = StringCache::GetIntlGroupPart(&pJVar1->stringCache);
        return pJVar5;
      }
    }
LAB_00b6c78e:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  case UNUM_EXPONENT_SIGN_FIELD:
    goto switchD_00b6c4f6_caseD_4;
  case UNUM_EXPONENT_FIELD:
    goto switchD_00b6c4f6_caseD_5;
  case UNUM_GROUPING_SEPARATOR_FIELD:
    goto switchD_00b6c4f6_caseD_6;
  case UNUM_CURRENCY_FIELD:
    pJVar5 = StringCache::GetIntlCurrencyPart(&pJVar1->stringCache);
    return pJVar5;
  case UNUM_PERCENT_FIELD:
    pJVar5 = StringCache::GetIntlPercentPart(&pJVar1->stringCache);
    return pJVar5;
  case UNUM_PERMILL_FIELD:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x8fe,"(false)","Unexpected permill field");
    if (!bVar3) goto LAB_00b6c78e;
    *puVar4 = 0;
  case UNUM_SIGN_FIELD:
    if (0.0 < this->num || this->num == 0.0) {
      pJVar5 = StringCache::GetIntlPlusSignPart(&pJVar1->stringCache);
      return pJVar5;
    }
    pJVar5 = StringCache::GetIntlMinusSignPart(&pJVar1->stringCache);
    return pJVar5;
  case ~UNUM_INTEGER_FIELD:
    pJVar5 = StringCache::GetIntlLiteralPart(&pJVar1->stringCache);
    return pJVar5;
  default:
    pJVar5 = StringCache::GetIntlUnknownPart(&pJVar1->stringCache);
    return pJVar5;
  }
}

Assistant:

JavascriptString *GetPartTypeString(UNumberFormatFields field)
        {
            JavascriptLibrary *library = sc->GetLibrary();

            // this is outside the switch because MSVC doesn't like that UnsetField is not a valid enum value
            if (field == UnsetField)
            {
                return library->GetIntlLiteralPartString();
            }

            switch (field)
            {
            case UNUM_INTEGER_FIELD:
            {
                if (JavascriptNumber::IsNan(num))
                {
                    return library->GetIntlNanPartString();
                }
                else if (!NumberUtilities::IsFinite(num))
                {
                    return library->GetIntlInfinityPartString();
                }
                else
                {
                    return library->GetIntlIntegerPartString();
                }
            }
            case UNUM_FRACTION_FIELD: return library->GetIntlFractionPartString();
            case UNUM_DECIMAL_SEPARATOR_FIELD: return library->GetIntlDecimalPartString();

            // The following three should only show up if UNUM_SCIENTIFIC is used, which Intl.NumberFormat doesn't currently use
            case UNUM_EXPONENT_SYMBOL_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent symbol field");
            case UNUM_EXPONENT_SIGN_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent sign field");
            case UNUM_EXPONENT_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent field");

            case UNUM_GROUPING_SEPARATOR_FIELD: return library->GetIntlGroupPartString();
            case UNUM_CURRENCY_FIELD: return library->GetIntlCurrencyPartString();
            case UNUM_PERCENT_FIELD: return library->GetIntlPercentPartString();

            // TODO(jahorto): Determine if this would ever be returned and what it would map to
            case UNUM_PERMILL_FIELD: AssertOrFailFastMsg(false, "Unexpected permill field");

            case UNUM_SIGN_FIELD: return num < 0 ? library->GetIntlMinusSignPartString() : library->GetIntlPlusSignPartString();

            // At the ECMA-402 TC39 call for May 2017, it was decided that we should treat unmapped parts as type: "unknown"
            default: return library->GetIntlUnknownPartString();
            }
        }